

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O1

void __thiscall test_iir_filter::test_method(test_iir_filter *this)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  check_is_close_t local_2d9;
  undefined8 local_2d8;
  double local_2d0;
  undefined8 *local_2c8;
  double *local_2c0;
  double *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined **local_280;
  undefined1 local_278;
  undefined8 *local_270;
  char *local_268;
  undefined **local_260;
  undefined1 local_258;
  undefined8 *local_250;
  undefined8 **local_248;
  undefined **local_240;
  undefined1 local_238;
  undefined8 *local_230;
  double **local_228;
  undefined **local_220;
  undefined1 local_218;
  undefined8 *local_210;
  double **local_208;
  assertion_result local_200;
  array<double,_7UL> signal;
  array<double,_7UL> response;
  iir_filter<6> lp;
  array<double,_7UL> a;
  array<double,_7UL> b;
  
  signal._M_elems[1] = 0.0;
  signal._M_elems[4] = 0.0;
  signal._M_elems[5] = 0.0;
  signal._M_elems[2] = 0.0;
  signal._M_elems[3] = 0.0;
  signal._M_elems[6] = 0.0;
  signal._M_elems[0] = 1.0;
  response._M_elems[4] = 3.15672364704611e-05;
  response._M_elems[5] = 7.65594176229739e-05;
  response._M_elems[2] = 2.7972345612513e-06;
  response._M_elems[3] = 1.07425029331562e-05;
  response._M_elems[0] = 4.24141395075581e-08;
  response._M_elems[1] = 4.88861571352154e-07;
  response._M_elems[6] = 0.000160949149809997;
  butter_lp<6>((tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> *)&lp,2048000.0,
               40000.0);
  b._M_elems[0] = lp.b_m._M_elems[6];
  b._M_elems[1] = lp.a_m._M_elems[0];
  b._M_elems[2] = lp.a_m._M_elems[1];
  b._M_elems[3] = lp.a_m._M_elems[2];
  b._M_elems[4] = lp.a_m._M_elems[3];
  b._M_elems[5] = lp.a_m._M_elems[4];
  b._M_elems[6] = lp.a_m._M_elems[5];
  a._M_elems[0] = lp.gain_m;
  a._M_elems[1] = lp.b_m._M_elems[0];
  a._M_elems[2] = lp.b_m._M_elems[1];
  a._M_elems[3] = lp.b_m._M_elems[2];
  a._M_elems[4] = lp.b_m._M_elems[3];
  a._M_elems[5] = lp.b_m._M_elems[4];
  a._M_elems[6] = lp.b_m._M_elems[5];
  iir_filter<6>::iir_filter(&lp,lp.a_m._M_elems[6],&b,&a);
  lVar1 = 0;
  do {
    local_2a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_298 = "";
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x40,&local_2b0);
    local_278 = 0;
    local_280 = &PTR__lazy_ostream_001139c8;
    local_270 = &boost::unit_test::lazy_ostream::inst;
    local_268 = "";
    local_2d0 = iir_filter<6>::operator()(&lp,*(double *)((long)signal._M_elems + lVar1));
    pdVar3 = (double *)((long)response._M_elems + lVar1);
    local_2d8 = 0x3d719799812dea11;
    boost::test_tools::check_is_close_t::operator()
              (&local_200,&local_2d9,*pdVar3,local_2d0,
               (percent_tolerance_t<double>)0x3d719799812dea11);
    local_290 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_288 = "";
    local_218 = 0;
    local_220 = &PTR__lazy_ostream_00113af8;
    local_210 = &boost::unit_test::lazy_ostream::inst;
    local_208 = &local_2b8;
    local_2c0 = &local_2d0;
    local_238 = 0;
    local_240 = &PTR__lazy_ostream_00113af8;
    local_230 = &boost::unit_test::lazy_ostream::inst;
    local_228 = &local_2c0;
    local_2c8 = &local_2d8;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_00113b38;
    local_250 = &boost::unit_test::lazy_ostream::inst;
    local_248 = &local_2c8;
    local_2b8 = pdVar3;
    boost::test_tools::tt_detail::report_assertion
              (&local_200,&local_280,&local_290,0x40,1,8,3,"response[counter]",&local_220,
               "lp(signal[counter])",&local_240,"::boost::math::fpc::percent_tolerance(1e-12)",
               &local_260);
    boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x38);
  uVar2 = 0;
  if ((long)lp.yv_m.m_end - (long)lp.yv_m.m_first >> 3 <= (long)lp.yv_m.m_size) {
    uVar2 = (ulong)((long)lp.yv_m.m_end - (long)lp.yv_m.m_buff) >> 3;
  }
  lp.yv_m.m_first = lp.yv_m.m_first + (lp.yv_m.m_size - uVar2);
  if (lp.yv_m.m_buff != (pointer)0x0) {
    operator_delete(lp.yv_m.m_buff);
  }
  uVar2 = 0;
  if ((long)lp.xv_m.m_end - (long)lp.xv_m.m_first >> 3 <= (long)lp.xv_m.m_size) {
    uVar2 = (ulong)((long)lp.xv_m.m_end - (long)lp.xv_m.m_buff) >> 3;
  }
  lp.xv_m.m_first = lp.xv_m.m_first + (lp.xv_m.m_size - uVar2);
  if (lp.xv_m.m_buff != (pointer)0x0) {
    operator_delete(lp.xv_m.m_buff);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_iir_filter)
{
    std::array<double, 7> signal = { 1.0 };
    // generated with octave signal package
    // >> pkg load signal;
    // >> [b,a] = butter(6, 2*40000/2048000);
    // >> v = impz(b, a, 7)
    std::array<double, 7> response = {
        4.24141395075581e-08, 4.88861571352154e-07, 2.79723456125130e-06,
        1.07425029331562e-05, 3.15672364704611e-05, 7.65594176229739e-05,
        1.60949149809997e-04
    };
    double gain;
    std::array<double, 7 > b;
    std::array<double, 7 > a;

    std::tie(gain, b, a) = butter_lp<6>(2048000, 40000);
    iir_filter<6> lp(gain, b, a);
    for(size_t counter = 0; counter != signal.size(); ++counter)
    {
        BOOST_CHECK_CLOSE(response[counter], lp(signal[counter]), 1e-12);
    }
}